

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void jsonArrayStep(sqlite3_context *ctx,int argc,sqlite3_value **argv)

{
  JsonString *p;
  JsonString *pStr;
  sqlite3_value **argv_local;
  int argc_local;
  sqlite3_context *ctx_local;
  
  p = (JsonString *)sqlite3_aggregate_context(ctx,0x88);
  if (p != (JsonString *)0x0) {
    if (p->zBuf == (char *)0x0) {
      jsonInit(p,ctx);
      jsonAppendChar(p,'[');
    }
    else if (1 < p->nUsed) {
      jsonAppendChar(p,',');
    }
    p->pCtx = ctx;
    jsonAppendValue(p,*argv);
  }
  return;
}

Assistant:

static void jsonArrayStep(
  sqlite3_context *ctx,
  int argc,
  sqlite3_value **argv
){
  JsonString *pStr;
  UNUSED_PARAMETER(argc);
  pStr = (JsonString*)sqlite3_aggregate_context(ctx, sizeof(*pStr));
  if( pStr ){
    if( pStr->zBuf==0 ){
      jsonInit(pStr, ctx);
      jsonAppendChar(pStr, '[');
    }else if( pStr->nUsed>1 ){
      jsonAppendChar(pStr, ',');
    }
    pStr->pCtx = ctx;
    jsonAppendValue(pStr, argv[0]);
  }
}